

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

UntypedMapIterator * __thiscall
google::protobuf::internal::UntypedMapBase::begin
          (UntypedMapIterator *__return_storage_ptr__,UntypedMapBase *this)

{
  NodeBase *local_20;
  NodeBase *node;
  map_index_t bucket_index;
  UntypedMapBase *this_local;
  
  if (this->index_of_first_non_null_ == this->num_buckets_) {
    node._4_4_ = 0;
    local_20 = (NodeBase *)0x0;
  }
  else {
    node._4_4_ = this->index_of_first_non_null_;
    local_20 = this->table_[node._4_4_];
    if (local_20 == (NodeBase *)0x0) {
      protobuf_assumption_failed
                ("node != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
                 ,0x22e);
    }
  }
  __return_storage_ptr__->node_ = local_20;
  __return_storage_ptr__->m_ = this;
  __return_storage_ptr__->bucket_index_ = node._4_4_;
  return __return_storage_ptr__;
}

Assistant:

inline UntypedMapIterator UntypedMapBase::begin() const {
  map_index_t bucket_index;
  NodeBase* node;
  if (index_of_first_non_null_ == num_buckets_) {
    bucket_index = 0;
    node = nullptr;
  } else {
    bucket_index = index_of_first_non_null_;
    node = table_[bucket_index];
    PROTOBUF_ASSUME(node != nullptr);
  }
  return UntypedMapIterator{node, this, bucket_index};
}